

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::compare
          (BitfieldInsertCaseInstance *this,void **inputs,void **outputs)

{
  DataType dataType;
  Precision precision_00;
  int iVar1;
  int integerLength_00;
  deUint32 dVar2;
  uint value;
  reference pvVar3;
  ostream *poVar4;
  Hex<8UL> hex;
  uint local_74;
  deUint32 ref;
  deUint32 mask;
  deInt32 out;
  deUint32 insert;
  deUint32 base;
  int compNdx;
  int bits;
  int offset;
  deUint32 cmpMask;
  int integerLength;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  BitfieldInsertCaseInstance *this_local;
  
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar3->varType);
  iVar1 = glu::getDataTypeScalarSize(dataType);
  integerLength_00 =
       shaderexecutor::anon_unknown_0::getShaderUintBitCount
                 ((this->super_IntegerFunctionTestInstance).m_shaderType,precision_00);
  dVar2 = shaderexecutor::anon_unknown_0::getLowBitMask(integerLength_00);
  insert = 0;
  while( true ) {
    if (iVar1 <= (int)insert) {
      return true;
    }
    if (*inputs[3] == 0x20) {
      local_74 = 0xffffffff;
    }
    else {
      local_74 = (1 << ((byte)*inputs[3] & 0x1f)) - 1;
    }
    value = *(uint *)((long)*inputs + (long)(int)insert * 4) &
            (local_74 << ((byte)*inputs[2] & 0x1f) ^ 0xffffffff) |
            (*(uint *)((long)inputs[1] + (long)(int)insert * 4) & local_74) <<
            ((byte)*inputs[2] & 0x1f);
    if ((*(uint *)((long)*outputs + (long)(int)insert * 4) & dVar2) != (value & dVar2)) break;
    insert = insert + 1;
  }
  poVar4 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,insert);
  poVar4 = std::operator<<(poVar4,"] = ");
  hex = tcu::toHex<unsigned_int>(value);
  tcu::Format::operator<<(poVar4,hex);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			cmpMask			= getLowBitMask(integerLength);
		const int				offset			= *((const int*)inputs[2]);
		const int				bits			= *((const int*)inputs[3]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	base	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	insert	= ((const deUint32*)inputs[1])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];

			const deUint32	mask	= bits == 32 ? ~0u : (1u<<bits)-1;
			const deUint32	ref		= (base & ~(mask<<offset)) | ((insert & mask)<<offset);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}